

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  int iVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = this->last_returned_size_;
  if (iVar1 < 1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x85);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (last_returned_size_) > (0): ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"BackUp() can only be called after a successful Next().");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
    iVar1 = this->last_returned_size_;
  }
  if (iVar1 < count) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x87);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (count) <= (last_returned_size_): ");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x88);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  this->position_ = this->position_ - count;
  this->last_returned_size_ = 0;
  return;
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  GOOGLE_CHECK_LE(count, last_returned_size_);
  GOOGLE_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}